

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O0

BN * __thiscall
BN::expSlidingWindow
          (BN *__return_storage_ptr__,BN *this,BN *exponent,BN *mod,
          vector<BN,_std::allocator<BN>_> *g,size_t K)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  int *piVar4;
  const_reference bn;
  BN local_f8;
  BN local_e0;
  BN local_c8;
  BN local_b0;
  int local_94;
  int local_90;
  int j_1;
  int j;
  int gx;
  int local_80;
  int l;
  BN local_70;
  BN local_58;
  int local_40;
  undefined1 local_39;
  int i;
  size_t K_local;
  vector<BN,_std::allocator<BN>_> *g_local;
  BN *mod_local;
  BN *exponent_local;
  BN *this_local;
  BN *A;
  
  local_39 = 0;
  _i = K;
  K_local = (size_t)g;
  g_local = (vector<BN,_std::allocator<BN>_> *)mod;
  mod_local = exponent;
  exponent_local = this;
  this_local = __return_storage_ptr__;
  bn1();
  sVar3 = bitCount(mod_local);
  local_40 = (int)sVar3 + -1;
  while (-1 < local_40) {
    bVar1 = bitI(mod_local,(long)local_40);
    if (bVar1) {
      gx = (local_40 - i) + 1;
      j = 0;
      piVar4 = std::max<int>(&gx,&j);
      local_80 = *piVar4;
      while (bVar1 = bitI(mod_local,(long)local_80), !bVar1) {
        local_80 = local_80 + 1;
      }
      j_1 = 0;
      for (local_90 = local_40; local_80 <= local_90; local_90 = local_90 + -1) {
        uVar2 = j_1 << 1;
        bVar1 = bitI(mod_local,(long)local_90);
        j_1 = uVar2 | bVar1;
      }
      for (local_94 = 0; local_94 < (local_40 - local_80) + 1; local_94 = local_94 + 1) {
        Qrt(&local_c8,__return_storage_ptr__);
        operator%(&local_b0,&local_c8,(BN *)g_local);
        operator=(__return_storage_ptr__,&local_b0);
        ~BN(&local_b0);
        ~BN(&local_c8);
      }
      bn = std::vector<BN,_std::allocator<BN>_>::operator[]
                     ((vector<BN,_std::allocator<BN>_> *)K_local,(long)j_1);
      operator*(&local_f8,__return_storage_ptr__,bn);
      operator%(&local_e0,&local_f8,(BN *)g_local);
      operator=(__return_storage_ptr__,&local_e0);
      ~BN(&local_e0);
      ~BN(&local_f8);
      local_40 = local_80 + -1;
    }
    else {
      Qrt(&local_70,__return_storage_ptr__);
      operator%(&local_58,&local_70,(BN *)g_local);
      operator=(__return_storage_ptr__,&local_58);
      ~BN(&local_58);
      ~BN(&local_70);
      local_40 = local_40 + -1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BN BN::expSlidingWindow(const BN& exponent, const BN& mod, const vector<BN>& g, size_t K) const {
    BN A(BN::bn1());
    int i = exponent.bitCount() - 1;
    while (i >= 0) {
        if(exponent.bitI(i) == 0) {
            A = A.Qrt() % mod;
            i--;
            continue;
        }
        int l = max(i - static_cast<int>(K) + 1, 0);
        while(exponent.bitI(l) == 0)
            l++;

        int gx = 0;
        for(int j = i; j >= l; j--)
            gx = (gx << 1) | exponent.bitI(j);
        for(int j = 0; j < i - l + 1; j++)
            A = A.Qrt() % mod;
        A = A * g[gx] % mod;
        i = l - 1;
    }
    return A;
}